

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::BasicGraphicsTestInstance
          (BasicGraphicsTestInstance *this,Context *context,StageFlagVector *stages,
          bool inRenderPass)

{
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  Handle<(vk::HandleType)17> *pHVar1;
  VkImageMemoryBarrier *local_e0;
  Vector<unsigned_int,_2> local_88;
  Move<vk::Handle<(vk::HandleType)18>_> local_80;
  RefData<vk::Handle<(vk::HandleType)18>_> local_60;
  Vector<unsigned_int,_2> local_3c [3];
  undefined1 local_21;
  StageFlagVector *pSStack_20;
  bool inRenderPass_local;
  StageFlagVector *stages_local;
  Context *context_local;
  BasicGraphicsTestInstance *this_local;
  
  local_21 = inRenderPass;
  pSStack_20 = stages;
  stages_local = (StageFlagVector *)context;
  context_local = (Context *)this;
  TimestampTestInstance::TimestampTestInstance
            (&this->super_TimestampTestInstance,context,stages,inRenderPass);
  (this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BasicGraphicsTestInstance_0165f700;
  tcu::Vector<unsigned_int,_2>::Vector(&this->m_renderSize,0x20,0x20);
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_depthFormat = VK_FORMAT_D16_UNORM;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_colorImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_colorImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_depthImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_depthImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_depthAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  local_e0 = this->m_imageLayoutBarriers;
  do {
    ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier(local_e0);
    local_e0 = local_e0 + 1;
  } while (local_e0 != (VkImageMemoryBarrier *)&this->m_vertexBufferAlloc);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexBufferAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexBuffer);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (&this->m_vertices);
  SimpleGraphicsPipelineBuilder::SimpleGraphicsPipelineBuilder
            (&this->m_pipelineBuilder,(Context *)stages_local);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_graphicsPipelines);
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])();
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[6])
            (this,(ulong)this->m_colorFormat,(ulong)this->m_depthFormat);
  tcu::Vector<unsigned_int,_2>::Vector(local_3c,&this->m_renderSize);
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[7])
            (this,local_3c,(ulong)this->m_colorFormat,(ulong)this->m_depthFormat);
  SimpleGraphicsPipelineBuilder::bindShaderStage
            (&this->m_pipelineBuilder,VK_SHADER_STAGE_VERTEX_BIT,"color_vert","main");
  SimpleGraphicsPipelineBuilder::bindShaderStage
            (&this->m_pipelineBuilder,VK_SHADER_STAGE_FRAGMENT_BIT,"color_frag","main");
  tcu::Vector<unsigned_int,_2>::Vector(&local_88,&this->m_renderSize);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  SimpleGraphicsPipelineBuilder::buildPipeline
            (&local_80,&this->m_pipelineBuilder,&local_88,(VkRenderPass)pHVar1->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_80);
  data.deleter.m_deviceIface = local_60.deleter.m_deviceIface;
  data.object.m_internal = local_60.object.m_internal;
  data.deleter.m_device = local_60.deleter.m_device;
  data.deleter.m_allocator = local_60.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            (&this->m_graphicsPipelines,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_80);
  return;
}

Assistant:

BasicGraphicsTestInstance::BasicGraphicsTestInstance(Context&              context,
													 const StageFlagVector stages,
													 const bool            inRenderPass)
													 : TimestampTestInstance (context,stages,inRenderPass)
													 , m_renderSize  (32, 32)
													 , m_colorFormat (VK_FORMAT_R8G8B8A8_UNORM)
													 , m_depthFormat (VK_FORMAT_D16_UNORM)
													 , m_pipelineBuilder (context)
{
	buildVertexBuffer();

	buildRenderPass(m_colorFormat, m_depthFormat);

	buildFrameBuffer(m_renderSize, m_colorFormat, m_depthFormat);

	m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_VERTEX_BIT, "color_vert", "main");
	m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_FRAGMENT_BIT, "color_frag", "main");

	m_graphicsPipelines = m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass);

}